

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

void csp_send_direct_iface
               (csp_id_t_conflict *idout,csp_packet_t *packet,csp_iface_t *iface,uint16_t via,
               int from_me)

{
  int iVar1;
  undefined2 in_CX;
  csp_packet_t *in_RDX;
  csp_packet_t *in_RSI;
  csp_id_t_conflict *in_RDI;
  int in_R8D;
  uint16_t bytes;
  int in_stack_00000028;
  uint16_t in_stack_0000002e;
  csp_iface_t *in_stack_00000030;
  csp_packet_t *in_stack_00000038;
  csp_id_t_conflict *in_stack_00000040;
  undefined6 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffde;
  uint16_t uVar2;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 uVar3;
  undefined1 include_header;
  
  uVar3 = (undefined1)in_CX;
  include_header = (undefined1)((ushort)in_CX >> 8);
  csp_output_hook(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002e,
                  in_stack_00000028);
  if (in_RDI != (csp_id_t_conflict *)&in_RSI->id) {
    csp_id_copy((csp_id_t_conflict *)&in_RSI->id,in_RDI);
  }
  if (in_R8D != 0) {
    if ((((in_RDI->flags & 8) != 0) &&
        (iVar1 = csp_hmac_append(in_RDX,(_Bool)include_header), iVar1 != 0)) ||
       (((in_RDI->flags & 1) != 0 &&
        (iVar1 = csp_crc32_append((csp_packet_t *)
                                  CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
        iVar1 != 0)))) goto LAB_0010991b;
    if (in_RDX != (csp_packet_t *)&csp_if_lo) {
      csp_promisc_add((csp_packet_t *)
                      CONCAT17(include_header,
                               CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffe4,in_R8D))));
    }
  }
  uVar2 = in_RSI->length;
  iVar1 = (**(code **)&in_RDX->length)
                    ((csp_iface_t *)in_RDX,CONCAT11(include_header,uVar3),in_RSI,in_R8D);
  if (iVar1 == 0) {
    *(uint32_t *)&in_RDX->field_0x2c = *(uint32_t *)&in_RDX->field_0x2c + 1;
    (in_RDX->field_5).data32[2] = (uint)uVar2 + (in_RDX->field_5).data32[2];
    return;
  }
LAB_0010991b:
  csp_buffer_free((void *)CONCAT17(include_header,
                                   CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffe4,in_R8D))));
  *(uint32_t *)((long)&in_RDX->next + 4) = *(uint32_t *)((long)&in_RDX->next + 4) + 1;
  return;
}

Assistant:

void csp_send_direct_iface(csp_id_t* idout, csp_packet_t * packet, csp_iface_t * iface, uint16_t via, int from_me) {

	csp_output_hook(idout, packet, iface, via, from_me);

	/* Copy identifier to packet (before crc and hmac) */
	if(idout != &packet->id) {
		csp_id_copy(&packet->id, idout);
	}


	/* Only encrypt packets from the current node */
	if (from_me) {
		/* Append HMAC */
		if (idout->flags & CSP_FHMAC) {
#if (CSP_USE_HMAC)
			/* Calculate and add HMAC (does not include header for backwards compatability with csp1.x) */
			if (csp_hmac_append(packet, false) != CSP_ERR_NONE) {
				/* HMAC append failed */
				goto tx_err;
			}
#else
			csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
			goto tx_err;
#endif
		}

		/* Append CRC32 */
		if (idout->flags & CSP_FCRC32) {
			/* Calculate and add CRC32 (does not include header for backwards compatability with csp1.x) */
			if (csp_crc32_append(packet) != CSP_ERR_NONE) {
				/* CRC32 append failed */
				goto tx_err;
			}
		}

#if (CSP_USE_PROMISC)
		/* Loopback traffic is added to promisc queue by the router */
		if (iface != &csp_if_lo) {
			csp_promisc_add(packet);
		}
#endif
	}

	/* Store length before passing to interface */
	uint16_t bytes = packet->length;

	if ((*iface->nexthop)(iface, via, packet, from_me) != CSP_ERR_NONE)
		goto tx_err;

	iface->tx++;
	iface->txbytes += bytes;

	return;

tx_err:
	csp_buffer_free(packet);
	iface->tx_error++;
	return;
}